

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

Publication * __thiscall
helics::ValueFederateManager::registerPublication
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  Publication **ppPVar1;
  string_view typeName;
  HelicsException *this_00;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  Publication *pPVar5;
  size_t sVar6;
  string_view searchValue1;
  string_view message;
  optional<unsigned_long> oVar7;
  InterfaceHandle coreID;
  handle pubHandle;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  InterfaceHandle local_5c;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string_view local_48;
  handle local_38;
  
  pcVar2 = key._M_str;
  sVar6 = key._M_len;
  local_58._M_len = sVar6;
  local_58._M_str = pcVar2;
  if (this->useJsonSerialization == false) {
    typeName._M_len._4_4_ = in_stack_ffffffffffffff8c;
    typeName._M_len._0_4_ = in_stack_ffffffffffffff88;
    typeName._M_str._0_4_ = in_stack_ffffffffffffff90;
    typeName._M_str._4_4_ = in_stack_ffffffffffffff94;
    local_48 = getCleanedTypeName(typeName);
  }
  else {
    local_48._M_str = "json";
    local_48._M_len = 4;
  }
  local_5c.hid = (*this->coreObject->_vptr_Core[0x24])
                           (this->coreObject,(ulong)(uint)(this->fedID).fid,sVar6,pcVar2,
                            local_48._M_len,local_48._M_str,(undefined4)units._M_len,
                            units._M_str._0_4_);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_38,&this->publications);
  if (local_58._M_len == 0) {
    oVar7 = gmlc::containers::
            DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)local_38.data,&local_5c,&this->fed,&local_5c,&local_58,&local_48,
                       (int)&units);
    uVar3 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  }
  else {
    searchValue1._M_str = local_58._M_str;
    searchValue1._M_len = local_58._M_len;
    oVar7 = gmlc::containers::
            DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)local_38.data,searchValue1,&local_5c,&this->fed,&local_5c,&local_58,
                       &local_48,&units);
    uVar3 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  }
  if ((uVar3 & 1) != 0) {
    lVar4 = (long)((local_38.data)->dataStorage).bsize;
    ppPVar1 = ((local_38.data)->dataStorage).dataptr;
    if (lVar4 == 0) {
      pPVar5 = ppPVar1[(((local_38.data)->dataStorage).csize >> 5) - 1] + 0x1f;
    }
    else {
      pPVar5 = ppPVar1[((local_38.data)->dataStorage).dataSlotIndex] + lVar4 + -1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38.m_handle_lock);
    return pPVar5;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Publication";
  message._M_len = 0x1e;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_004ba9e0;
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Publication& ValueFederateManager::registerPublication(std::string_view key,
                                                       std::string_view type,
                                                       std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerPublication(fedID, key, type, units);

    auto pubHandle = publications.lock();
    decltype(pubHandle->insert(key, coreID, fed, coreID, key, type, units)) active;
    if (!key.empty()) {
        active = pubHandle->insert(key, coreID, fed, coreID, key, type, units);
    } else {
        active = pubHandle->insert(no_search, coreID, fed, coreID, key, type, units);
    }

    if (active) {
        return pubHandle->back();
    }
    throw(RegistrationFailure("Unable to register Publication"));
}